

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd,int mi_row,int mi_col)

{
  int iVar1;
  uint8_t *dst;
  MV mv;
  InterPredParams local_108;
  
  dst = xd->plane[0].dst.buf;
  mv = (*xd->mi)->mv[0].as_mv;
  av1_init_inter_params
            (&local_108,(uint)xd->plane[0].width,(uint)xd->plane[0].height,mi_row * 4,mi_col * 4,
             xd->plane[0].subsampling_x,xd->plane[0].subsampling_y,xd->bd,
             (uint)xd->cur_buf->flags >> 3 & 1,0,xd->block_ref_scale_factors[0],xd->plane[0].pre,
             (*xd->mi)->interp_filters);
  iVar1 = xd->bd;
  local_108.conv_params.round_0 = 3;
  if (10 < iVar1) {
    local_108.conv_params.round_0 = iVar1 + -7;
  }
  local_108.conv_params.round_1 = 0xb;
  if (10 < iVar1) {
    local_108.conv_params.round_1 = 0x15 - iVar1;
  }
  local_108.conv_params.dst = xd->tmp_conv_dst;
  local_108.conv_params.do_average = 0;
  local_108.conv_params.dst_stride = 0x80;
  local_108.conv_params.plane = 0;
  local_108.conv_params.is_compound = 0;
  local_108.conv_params.use_dist_wtd_comp_avg = 0;
  build_one_inter_predictor(dst,xd->plane[0].dst.stride,&mv,&local_108);
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd, int mi_row, int mi_col) {
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  InterPredParams inter_pred_params;

  struct buf_2d *const dst_buf = &pd->dst;
  uint8_t *const dst = dst_buf->buf;
  const MV mv = xd->mi[0]->mv[0].as_mv;
  const struct scale_factors *const sf = xd->block_ref_scale_factors[0];

  av1_init_inter_params(&inter_pred_params, pd->width, pd->height, mi_y, mi_x,
                        pd->subsampling_x, pd->subsampling_y, xd->bd,
                        is_cur_buf_hbd(xd), false, sf, pd->pre,
                        xd->mi[0]->interp_filters);

  inter_pred_params.conv_params = get_conv_params_no_round(
      0, AOM_PLANE_Y, xd->tmp_conv_dst, MAX_SB_SIZE, false, xd->bd);

  inter_pred_params.conv_params.use_dist_wtd_comp_avg = 0;
  av1_enc_build_one_inter_predictor(dst, dst_buf->stride, &mv,
                                    &inter_pred_params);
}